

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_libc.c
# Opt level: O0

err_t Write(filestream *p,void *Data,size_t Size,size_t *Written)

{
  size_t local_40;
  ssize_t n;
  err_t Err;
  size_t *Written_local;
  size_t Size_local;
  void *Data_local;
  filestream *p_local;
  
  if (Size < 0x8000000000000000) {
    local_40 = write(p->fd,Data,Size);
    if ((long)local_40 < 0) {
      local_40 = 0;
      n = -0x16;
    }
    else {
      n = 0;
      if (local_40 != Size) {
        n = -0x16;
      }
    }
    if (Written != (size_t *)0x0) {
      *Written = local_40;
    }
    p_local = (filestream *)n;
  }
  else {
    p_local = (filestream *)0xffffffffffffffea;
  }
  return (err_t)p_local;
}

Assistant:

static err_t Write(filestream* p,const void* Data,size_t Size,size_t* Written)
{
    if (Size > SSIZE_MAX)
        return ERR_WRITE;
    err_t Err;
    ssize_t n = write(p->fd, Data, Size);

    if (n<0)
    {
        n=0;
        Err = ERR_WRITE;
    }
    else
        Err = (n != (ssize_t)Size) ? ERR_WRITE:ERR_NONE;

    if (Written)
        *Written = n;
    return Err;
}